

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

void __thiscall SkipList::SkipList(SkipList *this)

{
  uint uVar1;
  Node *pNVar2;
  
  std::random_device::random_device(&this->rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->mt,(ulong)uVar1);
  pNVar2 = (Node *)operator_new(0x38);
  pNVar2->right = (Node *)0x0;
  pNVar2->down = (Node *)0x0;
  pNVar2->key = 0;
  (pNVar2->value)._M_dataplus._M_p = (pointer)&(pNVar2->value).field_2;
  (pNVar2->value)._M_string_length = 0;
  (pNVar2->value).field_2._M_local_buf[0] = '\0';
  this->head = pNVar2;
  this->length = 0;
  this->valueSize = 0;
  return;
}

Assistant:

SkipList::SkipList()
    : rd(), mt(rd()), head(new Node), length(0), valueSize(0) {}